

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::UnknownFieldSet::MergeFromCodedStream
          (UnknownFieldSet *this,CodedInputStream *input)

{
  bool bVar1;
  int iVar2;
  UnknownFieldSet other;
  anon_union_16_2_b9f6da03_for_SooRep_0 local_28;
  
  local_28.long_rep.elements_int = 0;
  local_28.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
  bVar1 = internal::WireFormat::SkipMessage(input,(UnknownFieldSet *)&local_28.long_rep);
  if ((bVar1) && (input->legitimate_message_end_ == true)) {
    bVar1 = true;
    MergeFromAndDestroy(this,(UnknownFieldSet *)&local_28.long_rep);
  }
  else {
    bVar1 = false;
  }
  iVar2 = internal::SooRep::size
                    ((SooRep *)&local_28.long_rep,(local_28.long_rep.elements_int & 4) == 0);
  if (iVar2 != 0) {
    ClearFallback((UnknownFieldSet *)&local_28.long_rep);
  }
  RepeatedField<google::protobuf::UnknownField>::~RepeatedField
            ((RepeatedField<google::protobuf::UnknownField> *)&local_28.long_rep);
  return bVar1;
}

Assistant:

bool UnknownFieldSet::MergeFromCodedStream(io::CodedInputStream* input) {
  UnknownFieldSet other;
  if (internal::WireFormat::SkipMessage(input, &other) &&
      input->ConsumedEntireMessage()) {
    MergeFromAndDestroy(&other);
    return true;
  } else {
    return false;
  }
}